

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interact.cc
# Opt level: O3

bool contains_valid_namespaces(vw *all,features *f_src1,features *f_src2,interact *in)

{
  float fVar1;
  float *pfVar2;
  float *pfVar3;
  uchar uVar4;
  ostream *poVar5;
  uchar *puVar6;
  uchar local_12;
  uchar local_11;
  
  pfVar2 = (f_src1->values)._begin;
  if (((f_src1->values)._end != pfVar2) &&
     (pfVar3 = (f_src2->values)._begin, (f_src2->values)._end != pfVar3)) {
    fVar1 = *pfVar2;
    if ((fVar1 != 1.0) || (NAN(fVar1))) {
      std::__ostream_insert<char,std::char_traits<char>>
                (&(all->trace_message).super_ostream,"Namespace \'",0xb);
      uVar4 = in->n1;
      puVar6 = &local_12;
    }
    else {
      fVar1 = *pfVar3;
      if ((fVar1 == 1.0) && (!NAN(fVar1))) {
        return true;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (&(all->trace_message).super_ostream,"Namespace \'",0xb);
      uVar4 = in->n2;
      puVar6 = &local_11;
    }
    *puVar6 = uVar4;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (&(all->trace_message).super_ostream,(char *)puVar6,1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"\' misses anchor feature with value 1",0x24);
  }
  return false;
}

Assistant:

bool contains_valid_namespaces(vw& all, features& f_src1, features& f_src2, interact& in)
{
  // first feature must be 1 so we're sure that the anchor feature is present
  if (f_src1.size() == 0 || f_src2.size() == 0)
    return false;

  if (f_src1.values[0] != 1)
  {
    all.trace_message << "Namespace '" << (char)in.n1 << "' misses anchor feature with value 1";
    return false;
  }

  if (f_src2.values[0] != 1)
  {
    all.trace_message << "Namespace '" << (char)in.n2 << "' misses anchor feature with value 1";
    return false;
  }

  return true;
}